

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O2

int Gia_ManHashXorReal(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int Lit;
  int *piVar4;
  uint c;
  bool bVar5;
  
  if (p->fAddStrash != 0) {
    __assert_fail("p->fAddStrash == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaHash.c"
                  ,0x1d8,"int Gia_ManHashXorReal(Gia_Man_t *, int, int)");
  }
  if (iLit0 < 2) {
    bVar5 = iLit0 != 0;
    iLit0 = iLit1;
    iVar2 = iLit1;
    if (bVar5) {
LAB_001ed83e:
      iVar2 = Abc_LitNot(iLit0);
      return iVar2;
    }
  }
  else if (iLit1 < 2) {
    iVar2 = iLit0;
    if (iLit1 != 0) goto LAB_001ed83e;
  }
  else {
    iVar2 = 0;
    if (iLit0 != iLit1) {
      iVar2 = Abc_LitNot(iLit1);
      if (iVar2 != iLit0) {
        if (((char)p->nObjs == '\0') &&
           (iVar2 = (p->vHTable).nSize, iVar3 = Gia_ManAndNum(p), iVar2 * 2 < iVar3)) {
          Gia_ManHashResize(p);
        }
        iVar2 = iLit1;
        if ((uint)iLit0 >= (uint)iLit1 && iLit0 != iLit1) {
          iVar2 = iLit0;
        }
        if ((uint)iLit0 < (uint)iLit1) {
          iLit1 = iLit0;
        }
        iVar3 = Abc_LitIsCompl(iVar2);
        if (iVar3 != 0) {
          iVar2 = Abc_LitNot(iVar2);
        }
        c = (uint)(iVar3 != 0);
        iVar3 = Abc_LitIsCompl(iLit1);
        if (iVar3 != 0) {
          iLit1 = Abc_LitNot(iLit1);
          c = c ^ 1;
        }
        piVar4 = Gia_ManHashFind(p,iVar2,iLit1,-1);
        iVar3 = *piVar4;
        if (iVar3 == 0) {
          p->nHashMiss = p->nHashMiss + 1;
          iVar3 = (p->vHash).nSize;
          iVar1 = (p->vHash).nCap;
          Lit = Gia_ManAppendXorReal(p,iVar2,iLit1);
          if ((iVar1 <= iVar3) && (piVar4 = Gia_ManHashFind(p,iVar2,iLit1,-1), *piVar4 != 0)) {
            __assert_fail("*pPlace == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaHash.c"
                          ,0x1f7,"int Gia_ManHashXorReal(Gia_Man_t *, int, int)");
          }
          iVar3 = Abc_Lit2Var(Lit);
          *piVar4 = iVar3;
        }
        else {
          p->nHashHit = p->nHashHit + 1;
        }
        iVar2 = Abc_Var2Lit(iVar3,c);
        return iVar2;
      }
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int Gia_ManHashXorReal( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    int fCompl = 0;
    assert( p->fAddStrash == 0 );
    if ( iLit0 < 2 )
        return iLit0 ? Abc_LitNot(iLit1) : iLit1;
    if ( iLit1 < 2 )
        return iLit1 ? Abc_LitNot(iLit0) : iLit0;
    if ( iLit0 == iLit1 )
        return 0;
    if ( iLit0 == Abc_LitNot(iLit1) )
        return 1;
    if ( (p->nObjs & 0xFF) == 0 && 2 * Vec_IntSize(&p->vHTable) < Gia_ManAndNum(p) )
        Gia_ManHashResize( p );
    if ( iLit0 < iLit1 )
        iLit0 ^= iLit1, iLit1 ^= iLit0, iLit0 ^= iLit1;
    if ( Abc_LitIsCompl(iLit0) )
        iLit0 = Abc_LitNot(iLit0), fCompl ^= 1;
    if ( Abc_LitIsCompl(iLit1) )
        iLit1 = Abc_LitNot(iLit1), fCompl ^= 1;
    {
        int *pPlace = Gia_ManHashFind( p, iLit0, iLit1, -1 );
        if ( *pPlace )
        {
            p->nHashHit++;
            return Abc_Var2Lit( *pPlace, fCompl );
        }
        p->nHashMiss++;
        if ( Vec_IntSize(&p->vHash) < Vec_IntCap(&p->vHash) )
            *pPlace = Abc_Lit2Var( Gia_ManAppendXorReal( p, iLit0, iLit1 ) );
        else
        {
            int iNode = Gia_ManAppendXorReal( p, iLit0, iLit1 );
            pPlace = Gia_ManHashFind( p, iLit0, iLit1, -1 );
            assert( *pPlace == 0 );
            *pPlace = Abc_Lit2Var( iNode );
        }
        return Abc_Var2Lit( *pPlace, fCompl );
    }
}